

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::CallNative(SQVM *this,SQNativeClosure *nclosure,SQInteger nargs,SQInteger newbase,
                SQObjectPtr *retval,bool *suspend)

{
  bool bVar1;
  sqvector<long_long> *this_00;
  SQUnsignedInteger SVar2;
  SQObjectPtr *obj;
  SQVM *in_RCX;
  long in_RDX;
  long in_RSI;
  SQVM *in_RDI;
  SQInteger in_R8;
  undefined1 *in_R9;
  SQInteger in_stack_00000008;
  SQInteger ret;
  SQInteger i_1;
  SQInteger outers;
  SQInteger i;
  SQIntVec *tc;
  SQInteger tcs;
  SQInteger newtop;
  SQInteger nparamscheck;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  SQNativeClosure *in_stack_ffffffffffffff88;
  SQObjectPtr *in_stack_ffffffffffffff90;
  byte *this_01;
  SQVM *in_stack_ffffffffffffffa0;
  long lVar3;
  bool local_1;
  
  lVar3 = *(long *)(in_RSI + 0x30);
  if (in_RDI->_nnativecalls + 1 < 0x65) {
    if ((lVar3 == 0) || (((lVar3 < 1 || (lVar3 == in_RDX)) && ((-1 < lVar3 || (-lVar3 <= in_RDX)))))
       ) {
      this_00 = (sqvector<long_long> *)(in_RSI + 0x38);
      SVar2 = sqvector<long_long>::size(this_00);
      if (SVar2 != 0) {
        for (in_stack_ffffffffffffffa0 = (SQVM *)0x0;
            in_stack_ffffffffffffff7f =
                 (long)in_stack_ffffffffffffffa0 < in_RDX &&
                 (long)in_stack_ffffffffffffffa0 < (long)SVar2,
            (long)in_stack_ffffffffffffffa0 < in_RDX &&
            (long)in_stack_ffffffffffffffa0 < (long)SVar2;
            in_stack_ffffffffffffffa0 =
                 (SQVM *)((long)&(in_stack_ffffffffffffffa0->super_SQCollectable).super_SQRefCounted
                                 ._vptr_SQRefCounted + 1)) {
          if ((this_00->_vals[(long)in_stack_ffffffffffffffa0] != -1) &&
             (((ulong)(in_RDI->_stack)._vals
                      [(long)&(in_stack_ffffffffffffffa0->super_SQCollectable).super_SQRefCounted.
                              _vptr_SQRefCounted +
                       (long)&(in_RCX->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted].
                      super_SQObject._type & this_00->_vals[(long)in_stack_ffffffffffffffa0]) == 0))
          {
            Raise_ParamTypeError((SQVM *)outers,i_1,ret,in_stack_00000008);
            return false;
          }
        }
      }
      bVar1 = EnterFrame(in_RCX,in_R8,(SQInteger)in_R9,SUB81((ulong)lVar3 >> 0x38,0));
      if (bVar1) {
        ::SQObjectPtr::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        lVar3 = *(long *)(in_RSI + 0x58);
        for (this_01 = (byte *)0x0; (long)this_01 < lVar3;
            this_01 = (byte *)((long)&(((SQObjectPtr *)this_01)->super_SQObject)._type + 1)) {
          ::SQObjectPtr::operator=((SQObjectPtr *)this_01,(SQObjectPtr *)in_stack_ffffffffffffff88);
        }
        if (*(long *)(in_RSI + 0x60) != 0) {
          ::SQObjectPtr::operator=((SQObjectPtr *)this_01,(SQObject *)in_stack_ffffffffffffff88);
        }
        in_RDI->_nnativecalls = in_RDI->_nnativecalls + 1;
        obj = (SQObjectPtr *)(**(code **)(in_RSI + 0x68))();
        in_RDI->_nnativecalls = in_RDI->_nnativecalls + -1;
        *in_R9 = 0;
        if (obj == (SQObjectPtr *)0xfffffffffffffd66) {
          *in_R9 = 1;
        }
        else if ((long)obj < 0) {
          LeaveFrame(in_stack_ffffffffffffffa0);
          Raise_Error(in_RDI,(SQObjectPtr *)
                             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          return false;
        }
        if (obj == (SQObjectPtr *)0x0) {
          ::SQObjectPtr::Null((SQObjectPtr *)in_RDI);
        }
        else {
          ::SQObjectPtr::operator=((SQObjectPtr *)this_01,obj);
        }
        LeaveFrame(in_stack_ffffffffffffffa0);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      Raise_Error(in_RDI,"wrong number of parameters");
      local_1 = false;
    }
  }
  else {
    Raise_Error(in_RDI,"Native stack overflow");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::CallNative(SQNativeClosure *nclosure, SQInteger nargs, SQInteger newbase, SQObjectPtr &retval, bool &suspend)
{
    SQInteger nparamscheck = nclosure->_nparamscheck;
    SQInteger newtop = newbase + nargs + nclosure->_noutervalues;

    if (_nnativecalls + 1 > MAX_NATIVE_CALLS) {
        Raise_Error(_SC("Native stack overflow"));
        return false;
    }

    if(nparamscheck && (((nparamscheck > 0) && (nparamscheck != nargs)) ||
        ((nparamscheck < 0) && (nargs < (-nparamscheck)))))
    {
        Raise_Error(_SC("wrong number of parameters"));
        return false;
    }

    SQInteger tcs;
    SQIntVec &tc = nclosure->_typecheck;
    if((tcs = tc.size())) {
        for(SQInteger i = 0; i < nargs && i < tcs; i++) {
            if((tc._vals[i] != -1) && !(type(_stack._vals[newbase+i]) & tc._vals[i])) {
                Raise_ParamTypeError(i,tc._vals[i],type(_stack._vals[newbase+i]));
                return false;
            }
        }
    }

    if(!EnterFrame(newbase, newtop, false)) return false;
    ci->_closure  = nclosure;

    SQInteger outers = nclosure->_noutervalues;
    for (SQInteger i = 0; i < outers; i++) {
        _stack._vals[newbase+nargs+i] = nclosure->_outervalues[i];
    }
    if(nclosure->_env) {
        _stack._vals[newbase] = nclosure->_env->_obj;
    }

    _nnativecalls++;
    SQInteger ret = (nclosure->_function)(this);
    _nnativecalls--;

    suspend = false;
    if (ret == SQ_SUSPEND_FLAG) {
        suspend = true;
    }
    else if (ret < 0) {
        LeaveFrame();
        Raise_Error(_lasterror);
        return false;
    }
    if(ret) {
        retval = _stack._vals[_top-1];
    }
    else {
        retval.Null();
    }
    //retval = ret ? _stack._vals[_top-1] : _null_;
    LeaveFrame();
    return true;
}